

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::java::JavaGenerator::Generate
          (JavaGenerator *this,FileDescriptor *file,string *parameter,GeneratorContext *context,
          string *error)

{
  FileGenerator *pFVar1;
  undefined1 auVar2 [16];
  pointer puVar3;
  pointer ppVar4;
  bool bVar5;
  char cVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  ZeroCopyOutputStream *output;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  AlphaNum *pAVar10;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *annotation_collector_00;
  unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
  *file_generator;
  pointer __lhs;
  pointer puVar11;
  ulong uVar12;
  long lVar13;
  string *psVar14;
  pointer puVar15;
  string_view text;
  string_view text_00;
  string_view text_01;
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  file_generators;
  undefined1 local_2f0 [8];
  _Alloc_hider local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8;
  undefined2 local_2a8;
  FileDescriptor *file_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_annotations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string info_full_path;
  AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> annotation_collector;
  string package_dir;
  GeneratedCodeInfo annotations;
  string java_filename;
  Printer printer;
  string local_50;
  ZeroCopyOutputStream *pZVar9;
  undefined4 extraout_var_00;
  
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  options.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  text._M_str = (char *)&options;
  text._M_len = (size_t)(parameter->_M_dataplus)._M_p;
  pAVar10 = (AlphaNum *)error;
  file_local = file;
  ParseGeneratorParameter
            ((compiler *)parameter->_M_string_length,text,
             (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)context);
  ppVar4 = options.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_2f0[0] = false;
  local_2f0[1] = false;
  local_2f0[2] = false;
  local_2f0[3] = false;
  local_2f0[5] = false;
  local_2e8._M_p = (pointer)&local_2d8;
  local_2e0 = 0;
  local_2d8._M_local_buf[0] = '\0';
  local_2c8._M_p = (pointer)&local_2b8;
  local_2c0 = 0;
  local_2b8._M_local_buf[0] = '\0';
  local_2a8._0_1_ = false;
  local_2a8._1_1_ = true;
  local_2f0[4] = this->opensource_runtime_;
  for (__lhs = options.
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __lhs != ppVar4; __lhs = __lhs + 1) {
    bVar5 = std::operator==(&__lhs->first,"output_list_file");
    psVar14 = (string *)&local_2c8;
    if (bVar5) {
LAB_00b42fda:
      std::__cxx11::string::_M_assign(psVar14);
    }
    else {
      bVar5 = std::operator==(&__lhs->first,"immutable");
      if (bVar5) {
        local_2f0[0] = true;
      }
      else {
        bVar5 = std::operator==(&__lhs->first,"mutable");
        if (bVar5) {
          local_2f0[1] = true;
        }
        else {
          bVar5 = std::operator==(&__lhs->first,"shared");
          if (bVar5) {
            local_2f0[2] = true;
          }
          else {
            bVar5 = std::operator==(&__lhs->first,"lite");
            if (bVar5) {
              local_2f0[3] = true;
            }
            else {
              bVar5 = std::operator==(&__lhs->first,"annotate_code");
              if (bVar5) {
                local_2f0[5] = true;
              }
              else {
                bVar5 = std::operator==(&__lhs->first,"annotation_list_file");
                psVar14 = (string *)&local_2e8;
                if (bVar5) goto LAB_00b42fda;
                bVar5 = std::operator==(&__lhs->first,"experimental_strip_nonfunctional_codegen");
                if (!bVar5) {
                  printer.sink_._0_16_ =
                       absl::lts_20250127::NullSafeStringView("Unknown generator option: ");
                  annotations.super_Message.super_MessageLite._vptr_MessageLite =
                       (_func_int **)(__lhs->first)._M_string_length;
                  annotations.super_Message.super_MessageLite._internal_metadata_.ptr_ =
                       (intptr_t)(__lhs->first)._M_dataplus._M_p;
                  absl::lts_20250127::StrCat_abi_cxx11_
                            (&info_full_path,(lts_20250127 *)&printer,(AlphaNum *)&annotations,
                             (AlphaNum *)
                             annotations.super_Message.super_MessageLite._vptr_MessageLite);
                  std::__cxx11::string::operator=((string *)error,(string *)&info_full_path);
                  std::__cxx11::string::~string((string *)&info_full_path);
                  goto LAB_00b430c9;
                }
                local_2a8._0_1_ = true;
              }
            }
          }
        }
      }
    }
  }
  bVar5 = (bool)local_2f0[3];
  if (((bool)local_2f0[3] == true) && ((bool)local_2f0[1] == true)) {
    std::__cxx11::string::assign((char *)error);
LAB_00b430c9:
    bVar5 = false;
LAB_00b435df:
    Options::~Options((Options *)local_2f0);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&options);
    return bVar5;
  }
  cVar6 = local_2f0[0];
  if (((bool)local_2f0[0] == false) &&
     (((bool)local_2f0[1] == false && ((bool)local_2f0[2] == false)))) {
    cVar6 = '\x01';
    local_2f0[0] = true;
    local_2f0[2] = true;
    local_2f0._0_4_ = CONCAT13(bVar5,local_2f0._0_3_);
  }
  all_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  all_annotations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  all_annotations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  all_annotations.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  file_generators.
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  file_generators.
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  file_generators.
  super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (cVar6 != '\0') {
    annotations.super_Message.super_MessageLite._vptr_MessageLite._0_1_ = 1;
    std::
    make_unique<google::protobuf::compiler::java::FileGenerator,google::protobuf::FileDescriptor_const*&,google::protobuf::compiler::java::Options&,bool>
              ((FileDescriptor **)&printer,(Options *)&file_local,(bool *)local_2f0);
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
    ::
    emplace_back<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>
              ((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
                *)&file_generators,
               (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                *)&printer);
    std::
    unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   *)&printer);
  }
  puVar11 = file_generators.
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar15 = file_generators.
            super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((bool)local_2f0[1] == true) {
    auVar2[0xf] = 0;
    auVar2._0_15_ = (undefined1  [15])annotations.super_Message.super_MessageLite._1_15_;
    annotations.super_Message.super_MessageLite = (MessageLite)(auVar2 << 8);
    std::
    make_unique<google::protobuf::compiler::java::FileGenerator,google::protobuf::FileDescriptor_const*&,google::protobuf::compiler::java::Options&,bool>
              ((FileDescriptor **)&printer,(Options *)&file_local,(bool *)local_2f0);
    std::
    vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
    ::
    emplace_back<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>
              ((vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,std::default_delete<google::protobuf::compiler::java::FileGenerator>>>>
                *)&file_generators,
               (unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                *)&printer);
    std::
    unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
    ::~unique_ptr((unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                   *)&printer);
    puVar11 = file_generators.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar15 = file_generators.
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  while (puVar3 = file_generators.
                  super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, bVar5 = puVar11 == puVar15, !bVar5) {
    bVar7 = FileGenerator::Validate
                      ((puVar11->_M_t).
                       super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                       .
                       super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>
                       ._M_head_impl,error);
    puVar11 = puVar11 + 1;
    if (!bVar7) goto LAB_00b435bb;
  }
  for (puVar15 = file_generators.
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar3; puVar15 = puVar15 + 1
      ) {
    std::__cxx11::string::string
              ((string *)&local_50,
               (string *)
               &((puVar15->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
                 .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
                _M_head_impl)->java_package_);
    JavaPackageToDir(&package_dir,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    pFVar1 = (puVar15->_M_t).
             super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
             .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
             _M_head_impl;
    annotations.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         (intptr_t)(pFVar1->classname_)._M_dataplus._M_p;
    annotations.super_Message.super_MessageLite._vptr_MessageLite =
         (_func_int **)(pFVar1->classname_)._M_string_length;
    info_full_path._0_16_ = absl::lts_20250127::NullSafeStringView(".java");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&java_filename,(lts_20250127 *)&printer,(AlphaNum *)&annotations,
               (AlphaNum *)&info_full_path,pAVar10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&all_files,&java_filename);
    printer.sink_.buffer_ = java_filename._M_dataplus._M_p;
    printer.sink_.stream_ = (ZeroCopyOutputStream *)java_filename._M_string_length;
    pAVar10 = (AlphaNum *)java_filename._M_string_length;
    annotations.super_Message.super_MessageLite =
         (MessageLite)absl::lts_20250127::NullSafeStringView(".pb.meta");
    absl::lts_20250127::StrCat_abi_cxx11_
              (&info_full_path,(lts_20250127 *)&printer,(AlphaNum *)&annotations,pAVar10);
    if (local_2f0[5] == true) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&all_annotations,&info_full_path);
    }
    iVar8 = (*context->_vptr_GeneratorContext[2])(context,&java_filename);
    pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar8);
    GeneratedCodeInfo::GeneratedCodeInfo(&annotations);
    annotation_collector.super_AnnotationCollector._vptr_AnnotationCollector =
         (_func_int **)&PTR__AnnotationCollector_01675040;
    annotation_collector_00 = (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *)0x0;
    if (local_2f0[5] != false) {
      annotation_collector_00 = &annotation_collector;
    }
    annotation_collector.annotation_proto_ = &annotations;
    io::Printer::Printer(&printer,pZVar9,'$',&annotation_collector_00->super_AnnotationCollector);
    FileGenerator::Generate
              ((puVar15->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
               _M_head_impl,&printer);
    pAVar10 = (AlphaNum *)&all_annotations;
    FileGenerator::GenerateSiblings
              ((puVar15->_M_t).
               super___uniq_ptr_impl<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::java::FileGenerator_*,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::java::FileGenerator_*,_false>.
               _M_head_impl,&package_dir,context,&all_files,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pAVar10);
    if (local_2f0[5] == true) {
      iVar8 = (*context->_vptr_GeneratorContext[2])(context,&info_full_path);
      output = (ZeroCopyOutputStream *)CONCAT44(extraout_var_00,iVar8);
      MessageLite::SerializeToZeroCopyStream((MessageLite *)&annotations,output);
      if (output != (ZeroCopyOutputStream *)0x0) {
        (*output->_vptr_ZeroCopyOutputStream[1])(output);
      }
    }
    io::Printer::~Printer(&printer);
    GeneratedCodeInfo::~GeneratedCodeInfo(&annotations);
    if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar9->_vptr_ZeroCopyOutputStream[1])(pZVar9);
    }
    std::__cxx11::string::~string((string *)&info_full_path);
    std::__cxx11::string::~string((string *)&java_filename);
    std::__cxx11::string::~string((string *)&package_dir);
  }
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  ::clear(&file_generators);
  if (local_2c0 != 0) {
    iVar8 = (*context->_vptr_GeneratorContext[2])(context,&local_2c8);
    pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_01,iVar8);
    io::Printer::Printer(&printer,pZVar9,'$',(AnnotationCollector *)0x0);
    lVar13 = 0;
    for (uVar12 = 0;
        uVar12 < (ulong)((long)all_files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)all_files.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar12 = uVar12 + 1)
    {
      text_00._M_str = "$filename$\n";
      text_00._M_len = 0xb;
      io::Printer::Print<char[9],std::__cxx11::string>
                (&printer,text_00,(char (*) [9])"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((all_files.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
      lVar13 = lVar13 + 0x20;
    }
    io::Printer::~Printer(&printer);
    if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar9->_vptr_ZeroCopyOutputStream[1])();
    }
  }
  if (local_2e0 != 0) {
    iVar8 = (*context->_vptr_GeneratorContext[2])(context,&local_2e8);
    pZVar9 = (ZeroCopyOutputStream *)CONCAT44(extraout_var_02,iVar8);
    io::Printer::Printer(&printer,pZVar9,'$',(AnnotationCollector *)0x0);
    lVar13 = 0;
    for (uVar12 = 0;
        uVar12 < (ulong)((long)all_annotations.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)all_annotations.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5); uVar12 = uVar12 + 1)
    {
      text_01._M_str = "$filename$\n";
      text_01._M_len = 0xb;
      io::Printer::Print<char[9],std::__cxx11::string>
                (&printer,text_01,(char (*) [9])"filename",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&((all_annotations.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar13));
      lVar13 = lVar13 + 0x20;
    }
    io::Printer::~Printer(&printer);
    if (pZVar9 != (ZeroCopyOutputStream *)0x0) {
      (*pZVar9->_vptr_ZeroCopyOutputStream[1])();
    }
  }
LAB_00b435bb:
  std::
  vector<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::FileGenerator,_std::default_delete<google::protobuf::compiler::java::FileGenerator>_>_>_>
  ::~vector(&file_generators);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&all_annotations);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&all_files);
  goto LAB_00b435df;
}

Assistant:

bool JavaGenerator::Generate(const FileDescriptor* file,
                             const std::string& parameter,
                             GeneratorContext* context,
                             std::string* error) const {
  // -----------------------------------------------------------------
  // parse generator options

  std::vector<std::pair<std::string, std::string> > options;
  ParseGeneratorParameter(parameter, &options);
  Options file_options;

  file_options.opensource_runtime = opensource_runtime_;

  for (auto& option : options) {
    if (option.first == "output_list_file") {
      file_options.output_list_file = option.second;
    } else if (option.first == "immutable") {
      file_options.generate_immutable_code = true;
    } else if (option.first == "mutable") {
      file_options.generate_mutable_code = true;
    } else if (option.first == "shared") {
      file_options.generate_shared_code = true;
    } else if (option.first == "lite") {
      // Note: Java Lite does not guarantee API/ABI stability. We may choose to
      // break existing API in order to boost performance / reduce code size.
      file_options.enforce_lite = true;
    } else if (option.first == "annotate_code") {
      file_options.annotate_code = true;
    } else if (option.first == "annotation_list_file") {
      file_options.annotation_list_file = option.second;
    } else if (option.first == "experimental_strip_nonfunctional_codegen") {
      file_options.strip_nonfunctional_codegen = true;
    } else {
      *error = absl::StrCat("Unknown generator option: ", option.first);
      return false;
    }
  }

  if (file_options.enforce_lite && file_options.generate_mutable_code) {
    *error = "lite runtime generator option cannot be used with mutable API.";
    return false;
  }

  // By default we generate immutable code and shared code for immutable API.
  if (!file_options.generate_immutable_code &&
      !file_options.generate_mutable_code &&
      !file_options.generate_shared_code) {
    file_options.generate_immutable_code = true;
    file_options.generate_shared_code = true;
  }

  // -----------------------------------------------------------------


  std::vector<std::string> all_files;
  std::vector<std::string> all_annotations;


  std::vector<std::unique_ptr<FileGenerator>> file_generators;
  if (file_options.generate_immutable_code) {
    file_generators.emplace_back(
        std::make_unique<FileGenerator>(file, file_options,
                                        /* immutable = */ true));
  }
  if (file_options.generate_mutable_code) {
    file_generators.emplace_back(
        std::make_unique<FileGenerator>(file, file_options,
                                        /* mutable = */ false));
  }

  for (auto& file_generator : file_generators) {
    if (!file_generator->Validate(error)) {
      return false;
    }
  }

  for (auto& file_generator : file_generators) {
    std::string package_dir = JavaPackageToDir(file_generator->java_package());

    std::string java_filename =
        absl::StrCat(package_dir, file_generator->classname(), ".java");
    all_files.push_back(java_filename);
    std::string info_full_path = absl::StrCat(java_filename, ".pb.meta");
    if (file_options.annotate_code) {
      all_annotations.push_back(info_full_path);
    }

    // Generate main java file.
    std::unique_ptr<io::ZeroCopyOutputStream> output(
        context->Open(java_filename));
    GeneratedCodeInfo annotations;
    io::AnnotationProtoCollector<GeneratedCodeInfo> annotation_collector(
        &annotations);
    io::Printer printer(
        output.get(), '$',
        file_options.annotate_code ? &annotation_collector : nullptr);

    file_generator->Generate(&printer);

    // Generate sibling files.
    file_generator->GenerateSiblings(package_dir, context, &all_files,
                                     &all_annotations);

    if (file_options.annotate_code) {
      std::unique_ptr<io::ZeroCopyOutputStream> info_output(
          context->Open(info_full_path));
      annotations.SerializeToZeroCopyStream(info_output.get());
    }
  }


  file_generators.clear();

  // Generate output list if requested.
  if (!file_options.output_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> srclist_raw_output(
        context->Open(file_options.output_list_file));
    io::Printer srclist_printer(srclist_raw_output.get(), '$');
    for (int i = 0; i < all_files.size(); i++) {
      srclist_printer.Print("$filename$\n", "filename", all_files[i]);
    }
  }

  if (!file_options.annotation_list_file.empty()) {
    // Generate output list.  This is just a simple text file placed in a
    // deterministic location which lists the .java files being generated.
    std::unique_ptr<io::ZeroCopyOutputStream> annotation_list_raw_output(
        context->Open(file_options.annotation_list_file));
    io::Printer annotation_list_printer(annotation_list_raw_output.get(), '$');
    for (int i = 0; i < all_annotations.size(); i++) {
      annotation_list_printer.Print("$filename$\n", "filename",
                                    all_annotations[i]);
    }
  }

  return true;
}